

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void screen_wipe(tgestate_t *state,uint8_t *dst,uint8_t width,uint8_t height)

{
  char in_CL;
  byte in_DL;
  uint8_t *in_RSI;
  tgestate_t *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  uint8_t *curr_dst;
  undefined6 in_stack_00000010;
  uint8_t h;
  undefined8 local_20;
  undefined1 local_13;
  
  local_20 = in_RSI;
  local_13 = in_CL;
  do {
    memset(local_20,0,(ulong)in_DL);
    local_20 = get_next_scanline(in_RDI,local_20);
    local_13 = local_13 + -1;
  } while (local_13 != '\0');
  invalidate_bitmap((tgestate_t *)CONCAT17(width,CONCAT16(height,in_stack_00000010)),curr_dst,
                    unaff_retaddr_00,unaff_retaddr);
  return;
}

Assistant:

void screen_wipe(tgestate_t *state,
                 uint8_t    *dst,
                 uint8_t     width,
                 uint8_t     height)
{
  uint8_t  h;
  uint8_t *curr_dst;

  assert(state != NULL);
  assert(dst   != NULL);
  assert(width  > 0);
  assert(height > 0);

  h        = height;
  curr_dst = dst;
  do
  {
    memset(curr_dst, 0, width);
    curr_dst = get_next_scanline(state, curr_dst);
  }
  while (--h);

  /* Conv: Invalidation added over the original game. */
  invalidate_bitmap(state, dst, width * 8, height);
}